

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error astcenc_compress_reset(astcenc_context *ctxo)

{
  undefined8 uVar1;
  astcenc_error aVar2;
  
  aVar2 = ASTCENC_ERR_BAD_CONTEXT;
  if (((ctxo->context).config.flags & 0x10) == 0) {
    aVar2 = ASTCENC_SUCCESS;
    (ctxo->manage_avg).m_init_done = false;
    (ctxo->manage_avg).m_term_done = false;
    LOCK();
    (ctxo->manage_avg).m_is_cancelled._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (ctxo->manage_avg).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    (ctxo->manage_avg).m_done_count = 0;
    (ctxo->manage_avg).m_task_count = 0;
    (ctxo->manage_avg).m_callback = (astcenc_progress_callback)0x0;
    uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
    (ctxo->manage_avg).m_callback_min_diff = (float)(int)uVar1;
    (ctxo->manage_avg).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
    (ctxo->manage_compress).m_init_done = false;
    (ctxo->manage_compress).m_term_done = false;
    LOCK();
    (ctxo->manage_compress).m_is_cancelled._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (ctxo->manage_compress).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    (ctxo->manage_compress).m_done_count = 0;
    (ctxo->manage_compress).m_task_count = 0;
    (ctxo->manage_compress).m_callback = (astcenc_progress_callback)0x0;
    uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
    (ctxo->manage_compress).m_callback_min_diff = (float)(int)uVar1;
    (ctxo->manage_compress).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return aVar2;
}

Assistant:

astcenc_error astcenc_compress_reset(
	astcenc_context* ctxo
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	ctxo->manage_avg.reset();
	ctxo->manage_compress.reset();
	return ASTCENC_SUCCESS;
#endif
}